

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O0

string * __thiscall leveldb::Slice::ToString_abi_cxx11_(string *__return_storage_ptr__,Slice *this)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_19;
  Slice *local_18;
  Slice *this_local;
  
  pcVar1 = this->data_;
  uVar2 = this->size_;
  local_18 = this;
  this_local = (Slice *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,uVar2,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const { return std::string(data_, size_); }